

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_mllr.c
# Opt level: O3

int ps_mllr_free(ps_mllr_t *mllr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  if (mllr != (ps_mllr_t *)0x0) {
    iVar1 = mllr->refcnt;
    iVar2 = iVar1 + -1;
    mllr->refcnt = iVar2;
    if (iVar1 < 2) {
      if (0 < mllr->n_feat) {
        lVar3 = 0;
        do {
          if (mllr->A != (float32 ****)0x0) {
            ckd_free_3d(mllr->A[lVar3]);
          }
          if (mllr->b != (float32 ***)0x0) {
            ckd_free_2d(mllr->b[lVar3]);
          }
          if (mllr->h != (float32 ***)0x0) {
            ckd_free_2d(mllr->h[lVar3]);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < mllr->n_feat);
      }
      ckd_free(mllr->veclen);
      ckd_free(mllr->A);
      ckd_free(mllr->b);
      ckd_free(mllr->h);
      ckd_free(mllr);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
ps_mllr_free(ps_mllr_t *mllr)
{
    int i;

    if (mllr == NULL)
        return 0;
    if (--mllr->refcnt > 0)
        return mllr->refcnt;

    for (i = 0; i < mllr->n_feat; ++i) {
        if (mllr->A)
            ckd_free_3d(mllr->A[i]);
        if (mllr->b)
            ckd_free_2d(mllr->b[i]);
        if (mllr->h)
            ckd_free_2d(mllr->h[i]);
    }
    ckd_free(mllr->veclen);
    ckd_free(mllr->A);
    ckd_free(mllr->b);
    ckd_free(mllr->h);
    ckd_free(mllr);

    return 0;
}